

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O0

void __thiscall Nova::Simplex_Mesh<4>::Initialize_Incident_Elements(Simplex_Mesh<4> *this)

{
  size_t m;
  INDEX *pIVar1;
  Array<Nova::Array<int>_> *pAVar2;
  INDEX *pIVar3;
  int *piVar4;
  Array<int> *this_00;
  int local_58;
  int local_54;
  Vector<int,_4,_true> *pVStack_50;
  int i;
  INDEX *element;
  size_t t;
  int local_2c;
  Array<int> local_28;
  Simplex_Mesh<4> *local_10;
  Simplex_Mesh<4> *this_local;
  
  local_10 = this;
  if ((this->incident_elements != (Array<Nova::Array<int>_> *)0x0) &&
     (pAVar2 = this->incident_elements, pAVar2 != (Array<Nova::Array<int>_> *)0x0)) {
    Array<Nova::Array<int>_>::~Array(pAVar2);
    operator_delete(pAVar2);
  }
  pAVar2 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  t._3_1_ = 1;
  m = this->number_of_nodes;
  local_2c = 0;
  Array<int>::Array(&local_28,0,&local_2c);
  Array<Nova::Array<int>_>::Array(pAVar2,m,&local_28);
  t._3_1_ = 0;
  this->incident_elements = pAVar2;
  Array<int>::~Array(&local_28);
  for (element = (INDEX *)0x0; pIVar1 = element,
      pIVar3 = (INDEX *)Array<Nova::Vector<int,_4,_true>_>::size(&this->elements), pIVar1 < pIVar3;
      element = (INDEX *)((long)(element->_data)._M_elems + 1)) {
    pVStack_50 = Array<Nova::Vector<int,_4,_true>_>::operator()(&this->elements,(int)element);
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      pAVar2 = this->incident_elements;
      piVar4 = Vector<int,_4,_true>::operator[](pVStack_50,local_54);
      this_00 = Array<Nova::Array<int>_>::operator()(pAVar2,*piVar4);
      local_58 = (int)element;
      Array<int>::Append(this_00,&local_58);
    }
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Incident_Elements()
{
    if(incident_elements!=nullptr) delete incident_elements;
    incident_elements=new Array<Array<int>>(number_of_nodes);
    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) (*incident_elements)(element[i]).Append(t);}
}